

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O3

void Ssw_SmlAddPatternDyn(Ssw_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  Ssw_Sat_t *pSVar6;
  long lVar7;
  
  pSVar6 = p->pMSat;
  pVVar5 = pSVar6->vUsedPis;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      piVar3 = (int *)pVVar5->pArray[lVar7];
      if ((piVar3[6] & 7U) != 2) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSweep.c"
                      ,0xa5,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
      }
      uVar4 = Ssw_ObjSatNum((Ssw_Sat_t *)pSVar6->vSatVars,(Aig_Obj_t *)(ulong)(uint)piVar3[9]);
      if ((int)uVar4 < 1) {
        __assert_fail("nVarNum > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSweep.c"
                      ,0xa7,"void Ssw_SmlAddPatternDyn(Ssw_Man_t *)");
      }
      pSVar6 = p->pMSat;
      if (pSVar6->pSat->size <= (int)uVar4) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (pSVar6->pSat->model[uVar4] == 1) {
        if (0xfffffffd < (piVar3[6] & 7U) - 7) {
          __assert_fail("!Aig_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
        }
        iVar2 = *piVar3;
        if (((long)iVar2 < 0) || (p->vSimInfo->nSize <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar1 = (uint *)((long)p->vSimInfo->pArray[iVar2] + (long)(p->nPatterns >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)p->nPatterns & 0x1f);
      }
      lVar7 = lVar7 + 1;
      pVVar5 = pSVar6->vUsedPis;
    } while (lVar7 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Ssw_SmlAddPatternDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj;
    unsigned * pInfo;
    int i, nVarNum;
    // iterate through the PIs of the frames
    Vec_PtrForEachEntry( Aig_Obj_t *, p->pMSat->vUsedPis, pObj, i )
    {
        assert( Aig_ObjIsCi(pObj) );
        nVarNum = Ssw_ObjSatNum( p->pMSat, pObj );
        assert( nVarNum > 0 );
        if ( sat_solver_var_value( p->pMSat->pSat, nVarNum ) )
        {
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObj) );
            Abc_InfoSetBit( pInfo, p->nPatterns );
        }
    }
}